

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Manifold.cpp
# Opt level: O2

void __thiscall mnf::Manifold::display(Manifold *this)

{
  ostream *poVar1;
  allocator local_51;
  string local_50 [32];
  string local_30 [32];
  
  std::__cxx11::string::string(local_30,"",&local_51);
  (*this->_vptr_Manifold[5])(local_50,this,local_30,1);
  poVar1 = std::operator<<((ostream *)&std::cout,local_50);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void Manifold::display() const { std::cout << description() << std::endl; }